

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divdif.cpp
# Opt level: O1

void dif_basis_i(int ival,int ntab,double *xtab,double *diftab)

{
  ostream *poVar1;
  
  if ((0 < ival) && (ival <= ntab)) {
    if (0 < ntab) {
      memset(diftab,0,(ulong)(uint)ntab << 3);
    }
    diftab[(uint)ival] = 1.0;
    data_to_dif(ntab,xtab,diftab,diftab);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"DIF_BASIS_I - Fatal error!\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"  IVAL must be between 1 and ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ntab);
  std::operator<<(poVar1,".\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"  but your value is ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ival);
  std::operator<<(poVar1,"\n");
  exit(1);
}

Assistant:

void dif_basis_i ( int ival, int ntab, double xtab[], double diftab[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIF_BASIS_I: I-th Lagrange basis polynomial in divided difference form.
//
//  Discussion:
//
//    The I-th Lagrange basis polynomial for a set of NTAB X values XTAB,
//    L(I,NTAB,XTAB)(X) is a polynomial of order NTAB-1 which is zero at
//    XTAB(J) for J not equal to I, and 1 when J is equal to I.
//
//    The Lagrange basis polynomials have the property that the interpolating
//    polynomial through a set of NTAB data points (XTAB,YTAB) may be
//    represented as
//
//      P(X) = Sum ( 1 <= I <= N ) YTAB(I) * L(I,NTAB,XTAB)(X)
//
//    Higher order interpolation at selected points may be accomplished
//    using repeated X values, and scaled derivative values.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    05 September 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Carl deBoor,
//    A Practical Guide to Splines,
//    Springer, 2001,
//    ISBN: 0387953663,
//    LC: QA1.A647.v27.
//
//  Parameters:
//
//    Input, int IVAL, the index of the desired Lagrange basis polynomial.
//    IVAL should be between 1 and NTAB.
//
//    Input, int NTAB, the number of data points XTAB.
//
//    Input, double XTAB[NTAB], the X values upon which the Lagrange basis
//    polynomial is to be based.
//
//    Output, double DIFTAB[NTAB], the divided difference table for the IVAL-th
//    Lagrange basis polynomial.
//
{
  int i;
//
//  Check IVAL.
//
  if ( ival < 1 || ntab < ival )
  {
    cerr << "\n";
    cerr << "DIF_BASIS_I - Fatal error!\n";
    cerr << "  IVAL must be between 1 and " << ntab << ".\n";
    cerr << "  but your value is " << ival << "\n";
    exit ( 1 );
  }
//
//  Initialize DIFTAB to Delta(I,J).
//
  for ( i = 0; i <= ntab - 1; i++ )
  {
    diftab[i] = 0.0;
  }
  diftab[ival] = 1.0;
//
//  Compute the IVAL-th Lagrange basis polynomial.
//
  data_to_dif ( ntab, xtab, diftab, diftab );

  return;
}